

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketMonitor_UNIX.cpp
# Opt level: O0

void __thiscall FIX::SocketMonitor::SocketMonitor(SocketMonitor *this,int timeout)

{
  pair<int,_int> pVar1;
  clock_t cVar2;
  int local_2c;
  int iStack_28;
  pair<int,_int> sockets;
  int timeout_local;
  SocketMonitor *this_local;
  
  this->_vptr_SocketMonitor = (_func_int **)&PTR__SocketMonitor_00331708;
  this->m_timeout = timeout;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set(&this->m_connectSockets);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set(&this->m_readSockets);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set(&this->m_writeSockets);
  std::queue<int,std::deque<int,std::allocator<int>>>::
  queue<std::deque<int,std::allocator<int>>,void>
            ((queue<int,std::deque<int,std::allocator<int>>> *)&this->m_dropped);
  socket_init();
  pVar1 = socket_createpair();
  local_2c = pVar1.first;
  this->m_signal = local_2c;
  iStack_28 = pVar1.second;
  this->m_interrupt = iStack_28;
  socket_setnonblock(this->m_signal);
  socket_setnonblock(this->m_interrupt);
  std::set<int,_std::less<int>,_std::allocator<int>_>::insert
            (&this->m_readSockets,&this->m_interrupt);
  cVar2 = clock();
  this->m_ticks = cVar2;
  return;
}

Assistant:

SocketMonitor::SocketMonitor(int timeout)
    : m_timeout(timeout) {
  socket_init();

  std::pair<socket_handle, socket_handle> sockets = socket_createpair();
  m_signal = sockets.first;
  m_interrupt = sockets.second;
  socket_setnonblock(m_signal);
  socket_setnonblock(m_interrupt);
  m_readSockets.insert(m_interrupt);

  m_ticks = clock();
}